

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  uint in_ESI;
  _GLFWwindow *in_RDI;
  _GLFWwindow *window;
  _GLFWwindow *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    iVar1 = 0;
  }
  else if (in_ESI == 0x20001) {
    iVar1 = _glfwPlatformWindowFocused(in_RDI);
  }
  else if (in_ESI == 0x20002) {
    iVar1 = _glfwPlatformWindowIconified((_GLFWwindow *)0x57ab3a);
  }
  else if (in_ESI == 0x20003) {
    iVar1 = in_RDI->resizable;
  }
  else if (in_ESI == 0x20004) {
    iVar1 = _glfwPlatformWindowVisible(in_stack_00000060);
  }
  else if (in_ESI == 0x20005) {
    iVar1 = in_RDI->decorated;
  }
  else if (in_ESI == 0x20006) {
    iVar1 = in_RDI->autoIconify;
  }
  else if (in_ESI == 0x20007) {
    iVar1 = in_RDI->floating;
  }
  else if (in_ESI == 0x20008) {
    iVar1 = _glfwPlatformWindowMaximized
                      ((_GLFWwindow *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
  }
  else if (in_ESI == 0x2000a) {
    iVar1 = _glfwPlatformFramebufferTransparent
                      ((_GLFWwindow *)CONCAT44(0x2000a,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x2000b) {
    iVar1 = _glfwPlatformWindowHovered((_GLFWwindow *)handle);
  }
  else if (in_ESI == 0x2000c) {
    iVar1 = in_RDI->focusOnShow;
  }
  else if (in_ESI == 0x22001) {
    iVar1 = (in_RDI->context).client;
  }
  else if (in_ESI == 0x22002) {
    iVar1 = (in_RDI->context).major;
  }
  else if (in_ESI == 0x22003) {
    iVar1 = (in_RDI->context).minor;
  }
  else if (in_ESI == 0x22004) {
    iVar1 = (in_RDI->context).revision;
  }
  else if (in_ESI == 0x22005) {
    iVar1 = (in_RDI->context).robustness;
  }
  else if (in_ESI == 0x22006) {
    iVar1 = (in_RDI->context).forward;
  }
  else if (in_ESI == 0x22007) {
    iVar1 = (in_RDI->context).debug;
  }
  else if (in_ESI == 0x22008) {
    iVar1 = (in_RDI->context).profile;
  }
  else if (in_ESI == 0x22009) {
    iVar1 = (in_RDI->context).release;
  }
  else if (in_ESI == 0x2200a) {
    iVar1 = (in_RDI->context).noerror;
  }
  else if (in_ESI == 0x2200b) {
    iVar1 = (in_RDI->context).source;
  }
  else {
    _glfwInputError(0x10003,"Invalid window attribute 0x%08X",(ulong)in_ESI);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return _glfwPlatformWindowFocused(window);
        case GLFW_ICONIFIED:
            return _glfwPlatformWindowIconified(window);
        case GLFW_VISIBLE:
            return _glfwPlatformWindowVisible(window);
        case GLFW_MAXIMIZED:
            return _glfwPlatformWindowMaximized(window);
        case GLFW_HOVERED:
            return _glfwPlatformWindowHovered(window);
        case GLFW_FOCUS_ON_SHOW:
            return window->focusOnShow;
        case GLFW_TRANSPARENT_FRAMEBUFFER:
            return _glfwPlatformFramebufferTransparent(window);
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_FLOATING:
            return window->floating;
        case GLFW_AUTO_ICONIFY:
            return window->autoIconify;
        case GLFW_CLIENT_API:
            return window->context.client;
        case GLFW_CONTEXT_CREATION_API:
            return window->context.source;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->context.major;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->context.minor;
        case GLFW_CONTEXT_REVISION:
            return window->context.revision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->context.robustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->context.forward;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            return window->context.debug;
        case GLFW_OPENGL_PROFILE:
            return window->context.profile;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            return window->context.release;
        case GLFW_CONTEXT_NO_ERROR:
            return window->context.noerror;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
    return 0;
}